

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O3

HelicsFilter helicsFederateGetFilter(HelicsFederate fed,char *name,HelicsError *err)

{
  size_t sVar1;
  Filter *filter;
  char *pcVar2;
  HelicsFilter pvVar3;
  string_view filterName;
  shared_ptr<helics::Federate> fedObj;
  Federate *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  getFedSharedPtr(&local_30,(HelicsError *)fed);
  if (local_30 != (Federate *)0x0) {
    if (name == (char *)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001ad473;
      pcVar2 = "The supplied string argument is null and therefore invalid";
    }
    else {
      sVar1 = strlen(name);
      filterName._M_str = name;
      filterName._M_len = sVar1;
      filter = helics::Federate::getFilter(local_30,filterName);
      if ((filter->super_Interface).handle.hid != -1700000000) {
        pvVar3 = anon_unknown.dwarf_ba607::findOrCreateFederateFilter(fed,filter);
        goto LAB_001ad476;
      }
      pcVar2 = "the specified Filter name is not recognized";
    }
    err->error_code = -4;
    err->message = pcVar2;
  }
LAB_001ad473:
  pvVar3 = (HelicsFilter)0x0;
LAB_001ad476:
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return pvVar3;
}

Assistant:

HelicsFilter helicsFederateGetFilter(HelicsFederate fed, const char* name, HelicsError* err)
{
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    CHECK_NULL_STRING(name, nullptr);
    try {
        auto& filt = fedObj->getFilter(name);
        if (!filt.isValid()) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = invalidFiltName;
            return nullptr;
        }
        return findOrCreateFederateFilter(fed, filt);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}